

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl.c
# Opt level: O2

QDLDL_int QDLDL_factor(QDLDL_int n,QDLDL_int *Ap,QDLDL_int *Ai,QDLDL_float *Ax,QDLDL_int *Lp,
                      QDLDL_int *Li,QDLDL_float *Lx,QDLDL_float *D,QDLDL_float *Dinv,QDLDL_int *Lnz,
                      QDLDL_int *etree,QDLDL_bool *bwork,QDLDL_int *iwork,QDLDL_float *fwork)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  QDLDL_int QVar11;
  
  *Lp = 0;
  lVar5 = 0;
  lVar9 = 0;
  if (0 < n) {
    lVar9 = n;
  }
  for (; lVar9 != lVar5; lVar5 = lVar5 + 1) {
    Lp[lVar5 + 1] = Lnz[lVar5] + Lp[lVar5];
    bwork[lVar5] = '\0';
    fwork[lVar5] = 0.0;
    D[lVar5] = 0.0;
    iwork[n * 2 + lVar5] = Lp[lVar5];
  }
  dVar2 = *Ax;
  *D = dVar2;
  uVar4 = 0xffffffffffffffff;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    plVar1 = iwork + n;
    uVar4 = (ulong)(0.0 < dVar2);
    *Dinv = 1.0 / dVar2;
    lVar9 = 1;
    while (lVar9 < n) {
      lVar5 = Ap[lVar9 + 1];
      lVar8 = 0;
      for (QVar11 = Ap[lVar9]; QVar11 < lVar5; QVar11 = QVar11 + 1) {
        lVar6 = Ai[QVar11];
        if (lVar6 == lVar9) {
          D[lVar9] = Ax[QVar11];
        }
        else {
          fwork[lVar6] = Ax[QVar11];
          if (bwork[lVar6] == '\0') {
            bwork[lVar6] = '\x01';
            *plVar1 = lVar6;
            lVar7 = 0;
            lVar10 = 1;
            while (((lVar6 = etree[lVar6], lVar6 != -1 && (lVar6 < lVar9)) &&
                   (bwork[lVar6] != '\x01'))) {
              bwork[lVar6] = '\x01';
              plVar1[lVar10] = lVar6;
              lVar10 = lVar10 + 1;
              lVar7 = lVar7 + 1;
            }
            for (; lVar7 != -1; lVar7 = lVar7 + -1) {
              iwork[lVar8] = plVar1[lVar7];
              lVar8 = lVar8 + 1;
            }
          }
        }
      }
      while (0 < lVar8) {
        lVar8 = lVar8 + -1;
        lVar5 = iwork[lVar8];
        lVar6 = iwork[n * 2 + lVar5];
        dVar2 = fwork[lVar5];
        for (QVar11 = Lp[lVar5]; QVar11 < lVar6; QVar11 = QVar11 + 1) {
          fwork[Li[QVar11]] = fwork[Li[QVar11]] - Lx[QVar11] * dVar2;
        }
        Li[lVar6] = lVar9;
        dVar3 = Dinv[lVar5];
        Lx[lVar6] = dVar3 * dVar2;
        D[lVar9] = D[lVar9] - dVar3 * dVar2 * dVar2;
        iwork[n * 2 + lVar5] = iwork[n * 2 + lVar5] + 1;
        fwork[lVar5] = 0.0;
        bwork[lVar5] = '\0';
      }
      dVar2 = D[lVar9];
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return -1;
      }
      uVar4 = uVar4 + (0.0 < dVar2);
      Dinv[lVar9] = 1.0 / dVar2;
      lVar9 = lVar9 + 1;
    }
  }
  return uVar4;
}

Assistant:

QDLDL_int QDLDL_factor(const QDLDL_int    n,
                  const QDLDL_int*   Ap,
                  const QDLDL_int*   Ai,
                  const QDLDL_float* Ax,
                  QDLDL_int*   Lp,
                  QDLDL_int*   Li,
                  QDLDL_float* Lx,
                  QDLDL_float* D,
                  QDLDL_float* Dinv,
                  const QDLDL_int* Lnz,
                  const QDLDL_int* etree,
                  QDLDL_bool*  bwork,
                  QDLDL_int*   iwork,
                  QDLDL_float* fwork){

  QDLDL_int i,j,k,nnzY, bidx, cidx, nextIdx, nnzE, tmpIdx;
  QDLDL_int *yIdx, *elimBuffer, *LNextSpaceInCol;
  QDLDL_float *yVals;
  QDLDL_float yVals_cidx;
  QDLDL_bool  *yMarkers;
  QDLDL_int   positiveValuesInD = 0;

  //partition working memory into pieces
  yMarkers        = bwork;
  yIdx            = iwork;
  elimBuffer      = iwork + n;
  LNextSpaceInCol = iwork + n*2;
  yVals           = fwork;


  Lp[0] = 0; //first column starts at index zero

  for(i = 0; i < n; i++){

    //compute L column indices
    Lp[i+1] = Lp[i] + Lnz[i];   //cumsum, total at the end

    // set all Yidx to be 'unused' initially
    //in each column of L, the next available space
    //to start is just the first space in the column
    yMarkers[i]  = QDLDL_UNUSED;
    yVals[i]     = 0.0;
    D[i]         = 0.0;
    LNextSpaceInCol[i] = Lp[i];
  }

  // First element of the diagonal D.
  D[0]     = Ax[0];
  if(D[0] == 0.0){return -1;}
  if(D[0]  > 0.0){positiveValuesInD++;}
  Dinv[0] = 1/D[0];

  //Start from 1 here. The upper LH corner is trivially 0
  //in L b/c we are only computing the subdiagonal elements
  for(k = 1; k < n; k++){

    //NB : For each k, we compute a solution to
    //y = L(0:(k-1),0:k-1))\b, where b is the kth
    //column of A that sits above the diagonal.
    //The solution y is then the kth row of L,
    //with an implied '1' at the diagonal entry.

    //number of nonzeros in this row of L
    nnzY = 0;  //number of elements in this row

    //This loop determines where nonzeros
    //will go in the kth row of L, but doesn't
    //compute the actual values
    tmpIdx = Ap[k+1];

    for(i = Ap[k]; i < tmpIdx; i++){

      bidx = Ai[i];   // we are working on this element of b

      //Initialize D[k] as the element of this column
      //corresponding to the diagonal place.  Don't use
      //this element as part of the elimination step
      //that computes the k^th row of L
      if(bidx == k){
        D[k] = Ax[i];
        continue;
      }

      yVals[bidx] = Ax[i];   // initialise y(bidx) = b(bidx)

      // use the forward elimination tree to figure
      // out which elements must be eliminated after
      // this element of b
      nextIdx = bidx;

      if(yMarkers[nextIdx] == QDLDL_UNUSED){   //this y term not already visited

        yMarkers[nextIdx] = QDLDL_USED;     //I touched this one
        elimBuffer[0]     = nextIdx;  // It goes at the start of the current list
        nnzE              = 1;         //length of unvisited elimination path from here

        nextIdx = etree[bidx];

        while(nextIdx != QDLDL_UNKNOWN && nextIdx < k){
          if(yMarkers[nextIdx] == QDLDL_USED) break;

          yMarkers[nextIdx] = QDLDL_USED;   //I touched this one
          elimBuffer[nnzE] = nextIdx; //It goes in the current list
          nnzE++;                     //the list is one longer than before
          nextIdx = etree[nextIdx];   //one step further along tree

        } //end while

        // now I put the buffered elimination list into
        // my current ordering in reverse order
        while(nnzE){
          yIdx[nnzY++] = elimBuffer[--nnzE];
        } //end while
      } //end if

    } //end for i

    //This for loop places nonzeros values in the k^th row
    for(i = (nnzY-1); i >=0; i--){

      //which column are we working on?
      cidx = yIdx[i];

      // loop along the elements in this
      // column of L and subtract to solve to y
      tmpIdx = LNextSpaceInCol[cidx];
      yVals_cidx = yVals[cidx];
      for(j = Lp[cidx]; j < tmpIdx; j++){
        yVals[Li[j]] -= Lx[j]*yVals_cidx;
      }

      //Now I have the cidx^th element of y = L\b.
      //so compute the corresponding element of
      //this row of L and put it into the right place
      Li[tmpIdx] = k;
      Lx[tmpIdx] = yVals_cidx *Dinv[cidx];

      //D[k] -= yVals[cidx]*yVals[cidx]*Dinv[cidx];
      D[k] -= yVals_cidx*Lx[tmpIdx];
      LNextSpaceInCol[cidx]++;

      //reset the yvalues and indices back to zero and QDLDL_UNUSED
      //once I'm done with them
      yVals[cidx]     = 0.0;
      yMarkers[cidx]  = QDLDL_UNUSED;

    } //end for i

    //Maintain a count of the positive entries
    //in D.  If we hit a zero, we can't factor
    //this matrix, so abort
    if(D[k] == 0.0){return -1;}
    if(D[k]  > 0.0){positiveValuesInD++;}

    //compute the inverse of the diagonal
    Dinv[k]= 1/D[k];

  } //end for k

  return positiveValuesInD;

}